

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::IFF_Layer2::Decode(IFF_Layer2 *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  byte bVar2;
  allocator<char> local_51;
  IFF_ATC_NAVAIDS_FundamentalParameterData local_50;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x1b < KVar1) {
    std::
    vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
    ::clear(&this->m_vFPD);
    if (!ignoreHeader) {
      LayerHeader::Decode(&this->super_LayerHeader,stream);
    }
    (*(this->m_BmDt).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_BmDt,stream);
    (*(this->m_SOD).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_SOD,stream);
    bVar2 = 0;
    while( true ) {
      KVar1 = SecondaryOperationalData::GetNumberOfFundamentalParamSets(&this->m_SOD);
      if (KVar1 <= bVar2) break;
      IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FundamentalParameterData
                (&local_50,stream);
      std::
      vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
      ::emplace_back<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>
                (&this->m_vFPD,&local_50);
      IFF_ATC_NAVAIDS_FundamentalParameterData::~IFF_ATC_NAVAIDS_FundamentalParameterData(&local_50)
      ;
      bVar2 = bVar2 + 1;
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Decode",&local_51);
  KException::KException(this_00,(KString *)&local_50,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void IFF_Layer2::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( stream.GetBufferSize() < IFF_LAYER2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vFPD.clear();

	if( !ignoreHeader )
	{
		LayerHeader::Decode( stream );
	}

    stream >> KDIS_STREAM m_BmDt
           >> KDIS_STREAM m_SOD;

    for( KUINT8 i = 0; i < m_SOD.GetNumberOfFundamentalParamSets(); ++i )
    {
        m_vFPD.push_back( IFF_ATC_NAVAIDS_FundamentalParameterData( stream ) );
    }
}